

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void kurtosis_api_suite::test_ctor(void)

{
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4> *pbVar1;
  bool bVar2;
  undefined1 auStack_198 [8];
  moment_kurtosis<double,_4> massign;
  moment_kurtosis<double,_4> mover;
  moment_kurtosis<double,_4> assign;
  moment_kurtosis<double,_4> copy;
  moment_kurtosis<double,_4> filter;
  
  pbVar1 = (basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4> *)
           &copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
            super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
            super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
            super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
            sum;
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)4> *)pbVar1);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>::push(pbVar1,1.0);
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>::empty(pbVar1);
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x27f,"void kurtosis_api_suite::test_ctor()",!bVar2);
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4> *)
                     &assign.
                      super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>
                      .passive.sum);
  boost::detail::test_impl
            ("!copy.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x283,"void kurtosis_api_suite::test_ctor()",!bVar2);
  pbVar1 = (basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4> *)
           &mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
            super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
            super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
            super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
            sum;
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)4> *)pbVar1);
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>::empty(pbVar1);
  boost::detail::test_impl
            ("!assign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x288,"void kurtosis_api_suite::test_ctor()",!bVar2);
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4> *)
                     &massign.
                      super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>
                      .passive.sum);
  boost::detail::test_impl
            ("!mover.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x28c,"void kurtosis_api_suite::test_ctor()",!bVar2);
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)4> *)auStack_198);
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.passive.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  auStack_198 = (undefined1  [8])
                mover.
                super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
                super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
                super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
                super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.
                passive.sum.kurtosis;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
  super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)4,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)4>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>.active.
       super_basic_moment<double,_(trial::online::with)3>.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)4> *)
                     auStack_198);
  boost::detail::test_impl
            ("!massign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x291,"void kurtosis_api_suite::test_ctor()",(bool)(bVar2 - 1U & 1));
  return;
}

Assistant:

void test_ctor()
{
    interim::moment_kurtosis<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST(!filter.empty());

    // Copy constructor
    interim::moment_kurtosis<double, 4> copy(filter);
    TRIAL_TEST(!copy.empty());

    // Copy assignment
    interim::moment_kurtosis<double, 4> assign;
    assign = filter;
    TRIAL_TEST(!assign.empty());

    // Move constructor
    interim::moment_kurtosis<double, 4> mover(std::move(copy));
    TRIAL_TEST(!mover.empty());

    // Move assignment
    interim::moment_kurtosis<double, 4> massign;
    massign = std::move(assign);
    TRIAL_TEST(!massign.empty());
}